

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

HairMaterial *
pbrt::HairMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *message;
  uintptr_t iptr;
  undefined8 uVar6;
  undefined8 uVar7;
  RGBUnboundedSpectrum RVar8;
  FloatTextureHandle pheomelanin;
  FloatTextureHandle eumelanin;
  SpectrumTextureHandle sigma_a;
  SpectrumTextureHandle color;
  FloatTextureHandle alpha;
  FloatTextureHandle beta_n;
  FloatTextureHandle beta_m;
  FloatTextureHandle eta;
  long *local_a8 [2];
  long local_98 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  HairMaterial *pHVar5;
  
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"sigma_a","");
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)local_78,(string *)parameters,(SpectrumType)local_a8,
             (Allocator)0x1);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"color","");
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)(local_78 + 8),(string *)parameters,
             (SpectrumType)local_a8,(Allocator)0x0);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"eumelanin","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_88 + 8),(string *)parameters,
             (memory_resource *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"pheomelanin","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)local_88,(string *)parameters,(memory_resource *)local_a8
            );
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if ((local_78._0_8_ & 0xffffffffffff) == 0) {
    if ((local_78._8_8_ & 0xffffffffffff) == 0) {
      if (((local_88._8_8_ & 0xffffffffffff) == 0) && ((local_88._0_8_ & 0xffffffffffff) == 0)) {
        uVar6 = 0;
        uVar7 = 0;
        RVar8 = HairBxDF::SigmaAFromConcentration(1.3,0.0);
        local_48 = RVar8.rsp._4_8_;
        local_38 = RVar8._0_8_;
        uStack_40 = uVar7;
        uStack_30 = uVar6;
        iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,4);
        auVar2._8_8_ = uStack_30;
        auVar2._0_8_ = local_38;
        auVar1._8_8_ = uStack_40;
        auVar1._0_8_ = local_48;
        auVar1 = vunpcklpd_avx(auVar2,auVar1);
        *(undefined1 (*) [16])CONCAT44(extraout_var_00,iVar3) = auVar1;
        iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
        *(ulong *)CONCAT44(extraout_var_01,iVar4) =
             CONCAT44(extraout_var_00,iVar3) | 0x5000000000000;
        local_78._0_8_ = CONCAT44(extraout_var_01,iVar4) | 0x5000000000000;
      }
      goto LAB_004e512b;
    }
    if ((local_88._8_8_ & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"color\" was provided.");
    }
    if ((local_88._0_8_ & 0xffffffffffff) == 0) goto LAB_004e512b;
    message = "Ignoring \"pheomelanin\" parameter since \"color\" was provided.";
  }
  else {
    if ((local_78._8_8_ & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"color\" parameter since \"sigma_a\" was provided.");
    }
    if ((local_88._8_8_ & 0xffffffffffff) != 0) {
      Warning(loc,"Ignoring \"eumelanin\" parameter since \"sigma_a\" was provided.");
    }
    if ((local_88._0_8_ & 0xffffffffffff) == 0) goto LAB_004e512b;
    message = "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was provided.";
  }
  Warning(loc,message);
LAB_004e512b:
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"eta","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_58 + 8),(string *)parameters,1.55,
             (memory_resource *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"beta_m","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_58,(string *)parameters,0.3,
             (memory_resource *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"beta_n","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_68 + 8),(string *)parameters,0.3,
             (memory_resource *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"alpha","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_68,(string *)parameters,2.0,
             (memory_resource *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x40,8);
  pHVar5 = (HairMaterial *)CONCAT44(extraout_var,iVar3);
  (pHVar5->sigma_a).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_78._0_8_;
  (pHVar5->color).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_78._8_8_;
  (pHVar5->eumelanin).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_88._8_8_;
  (pHVar5->pheomelanin).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_88._0_8_;
  (pHVar5->eta).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_58._8_8_;
  (pHVar5->beta_m).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_58._0_8_;
  (pHVar5->beta_n).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_68._8_8_;
  (pHVar5->alpha).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_68._0_8_;
  return pHVar5;
}

Assistant:

HairMaterial *HairMaterial::Create(const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle sigma_a =
        parameters.GetSpectrumTextureOrNull("sigma_a", SpectrumType::Unbounded, alloc);
    SpectrumTextureHandle color =
        parameters.GetSpectrumTextureOrNull("color", SpectrumType::Albedo, alloc);
    FloatTextureHandle eumelanin = parameters.GetFloatTextureOrNull("eumelanin", alloc);
    FloatTextureHandle pheomelanin =
        parameters.GetFloatTextureOrNull("pheomelanin", alloc);
    if (sigma_a) {
        if (color)
            Warning(loc, R"(Ignoring "color" parameter since "sigma_a" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"sigma_a\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was "
                         "provided.");
    } else if (color) {
        if (sigma_a)
            Warning(loc, R"(Ignoring "sigma_a" parameter since "color" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"color\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"color\" was "
                         "provided.");
    } else if (eumelanin || pheomelanin) {
        if (sigma_a)
            Warning(loc, "Ignoring \"sigma_a\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
        if (color)
            Warning(loc, "Ignoring \"color\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
    } else {
        // Default: brown-ish hair.
        sigma_a = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<RGBUnboundedSpectrum>(
                HairBxDF::SigmaAFromConcentration(1.3, 0.)));
    }

    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.55f, alloc);
    FloatTextureHandle beta_m = parameters.GetFloatTexture("beta_m", 0.3f, alloc);
    FloatTextureHandle beta_n = parameters.GetFloatTexture("beta_n", 0.3f, alloc);
    FloatTextureHandle alpha = parameters.GetFloatTexture("alpha", 2.f, alloc);

    return alloc.new_object<HairMaterial>(sigma_a, color, eumelanin, pheomelanin, eta,
                                          beta_m, beta_n, alpha);
}